

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONWorkflowPresets.cxx
# Opt level: O0

ReadFileResult
cmCMakePresetsGraphInternal::WorkflowPresetsHelper
          (vector<cmCMakePresetsGraph::WorkflowPreset,_std::allocator<cmCMakePresetsGraph::WorkflowPreset>_>
           *out,Value *value)

{
  int iVar1;
  ReadFileResult RVar2;
  Object<cmCMakePresetsGraph::WorkflowPreset> *in_R8;
  Object<cmCMakePresetsGraph::WorkflowPreset> local_40;
  Value *local_18;
  Value *value_local;
  vector<cmCMakePresetsGraph::WorkflowPreset,_std::allocator<cmCMakePresetsGraph::WorkflowPreset>_>
  *out_local;
  
  local_18 = value;
  value_local = (Value *)out;
  if (WorkflowPresetsHelper(std::vector<cmCMakePresetsGraph::WorkflowPreset,std::allocator<cmCMakePresetsGraph::WorkflowPreset>>&,Json::Value_const*)
      ::helper == '\0') {
    iVar1 = __cxa_guard_acquire(&WorkflowPresetsHelper(std::vector<cmCMakePresetsGraph::WorkflowPreset,std::allocator<cmCMakePresetsGraph::WorkflowPreset>>&,Json::Value_const*)
                                 ::helper);
    if (iVar1 != 0) {
      cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
      Object<cmCMakePresetsGraph::WorkflowPreset>::Object
                (&local_40,
                 (Object<cmCMakePresetsGraph::WorkflowPreset> *)
                 (anonymous_namespace)::WorkflowPresetHelper);
      cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
      Vector<cmCMakePresetsGraph::WorkflowPreset,cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::WorkflowPreset>>
                (&WorkflowPresetsHelper::helper,
                 (cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult> *)0x0,INVALID_PRESETS,
                 (ReadFileResult)&local_40,in_R8);
      cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
      Object<cmCMakePresetsGraph::WorkflowPreset>::~Object(&local_40);
      __cxa_atexit(std::
                   function<cmCMakePresetsGraph::ReadFileResult_(std::vector<cmCMakePresetsGraph::WorkflowPreset,_std::allocator<cmCMakePresetsGraph::WorkflowPreset>_>_&,_const_Json::Value_*)>
                   ::~function,&WorkflowPresetsHelper::helper,&__dso_handle);
      __cxa_guard_release(&WorkflowPresetsHelper(std::vector<cmCMakePresetsGraph::WorkflowPreset,std::allocator<cmCMakePresetsGraph::WorkflowPreset>>&,Json::Value_const*)
                           ::helper);
    }
  }
  RVar2 = std::
          function<cmCMakePresetsGraph::ReadFileResult_(std::vector<cmCMakePresetsGraph::WorkflowPreset,_std::allocator<cmCMakePresetsGraph::WorkflowPreset>_>_&,_const_Json::Value_*)>
          ::operator()(&WorkflowPresetsHelper::helper,
                       (vector<cmCMakePresetsGraph::WorkflowPreset,_std::allocator<cmCMakePresetsGraph::WorkflowPreset>_>
                        *)value_local,local_18);
  return RVar2;
}

Assistant:

cmCMakePresetsGraph::ReadFileResult WorkflowPresetsHelper(
  std::vector<cmCMakePresetsGraph::WorkflowPreset>& out,
  const Json::Value* value)
{
  static auto const helper =
    cmJSONHelperBuilder<ReadFileResult>::Vector<WorkflowPreset>(
      ReadFileResult::READ_OK, ReadFileResult::INVALID_PRESETS,
      WorkflowPresetHelper);

  return helper(out, value);
}